

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void (anonymous_namespace)::miniz::tdefl_huffman_enforce_max_code_size
               (int *pNum_codes,int code_list_len,int max_code_size)

{
  int iVar1;
  mz_uint32 total;
  int i;
  int max_code_size_local;
  int code_list_len_local;
  int *pNum_codes_local;
  
  total = 0;
  if (1 < code_list_len) {
    for (i = max_code_size + 1; iVar1 = max_code_size, i < 0x21; i = i + 1) {
      pNum_codes[max_code_size] = pNum_codes[i] + pNum_codes[max_code_size];
    }
    while (i = iVar1, 0 < i) {
      total = (pNum_codes[i] << ((byte)max_code_size - (char)i & 0x1f)) + total;
      iVar1 = i + -1;
    }
    for (; (ulong)total != 1L << ((byte)max_code_size & 0x3f); total = total - 1) {
      pNum_codes[max_code_size] = pNum_codes[max_code_size] + -1;
      for (i = max_code_size + -1; 0 < i; i = i + -1) {
        if (pNum_codes[i] != 0) {
          pNum_codes[i] = pNum_codes[i] + -1;
          pNum_codes[i + 1] = pNum_codes[i + 1] + 2;
          break;
        }
      }
    }
  }
  return;
}

Assistant:

static void tdefl_huffman_enforce_max_code_size(int *pNum_codes,
                                                int code_list_len,
                                                int max_code_size) {
  int i;
  mz_uint32 total = 0;
  if (code_list_len <= 1)
    return;
  for (i = max_code_size + 1; i <= TDEFL_MAX_SUPPORTED_HUFF_CODESIZE; i++)
    pNum_codes[max_code_size] += pNum_codes[i];
  for (i = max_code_size; i > 0; i--)
    total += (((mz_uint32)pNum_codes[i]) << (max_code_size - i));
  while (total != (1UL << max_code_size)) {
    pNum_codes[max_code_size]--;
    for (i = max_code_size - 1; i > 0; i--)
      if (pNum_codes[i]) {
        pNum_codes[i]--;
        pNum_codes[i + 1] += 2;
        break;
      }
    total--;
  }
}